

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void P_CheckWeaponFire(player_t *player)

{
  AWeapon *pAVar1;
  
  pAVar1 = player->ReadyWeapon;
  if (pAVar1 != (AWeapon *)0x0) {
    if (((player->WeaponState & 1) == 0) || (((player->cmd).ucmd.buttons & 1) == 0)) {
      if (((player->WeaponState & 4) == 0) || (((player->cmd).ucmd.buttons & 0x20) == 0)) {
        player->attackdown = false;
      }
      else if ((player->attackdown != true) || (((pAVar1->super_AInventory).field_0x4dc & 1) == 0))
      {
        player->attackdown = true;
        P_FireWeaponAlt(player,(FState *)0x0);
        return;
      }
    }
    else if ((player->attackdown != true) || (((pAVar1->super_AInventory).field_0x4dc & 1) == 0)) {
      player->attackdown = true;
      P_FireWeapon(player,(FState *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void P_CheckWeaponFire (player_t *player)
{
	AWeapon *weapon = player->ReadyWeapon;

	if (weapon == NULL)
		return;

	// Check for fire. Some weapons do not auto fire.
	if ((player->WeaponState & WF_WEAPONREADY) && (player->cmd.ucmd.buttons & BT_ATTACK))
	{
		if (!player->attackdown || !(weapon->WeaponFlags & WIF_NOAUTOFIRE))
		{
			player->attackdown = true;
			P_FireWeapon (player, NULL);
			return;
		}
	}
	else if ((player->WeaponState & WF_WEAPONREADYALT) && (player->cmd.ucmd.buttons & BT_ALTATTACK))
	{
		if (!player->attackdown || !(weapon->WeaponFlags & WIF_NOAUTOFIRE))
		{
			player->attackdown = true;
			P_FireWeaponAlt (player, NULL);
			return;
		}
	}
	else
	{
		player->attackdown = false;
	}
}